

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void fullsize_smooth_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  byte bVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  
  iVar11 = compptr->width_in_blocks * 8;
  uVar2 = cinfo->image_width;
  iVar8 = cinfo->max_v_samp_factor;
  if (-2 < iVar8 && 0 < (int)(iVar11 - uVar2)) {
    uVar16 = 0;
    do {
      memset(input_data[uVar16 - 1] + uVar2,(uint)input_data[uVar16 - 1][(ulong)uVar2 - 1],
             (ulong)(~uVar2 + iVar11) + 1);
      uVar16 = uVar16 + 1;
    } while (iVar8 + 2 != uVar16);
  }
  if (0 < compptr->v_samp_factor) {
    iVar9 = cinfo->smoothing_factor * -0x200 + 0x10000;
    iVar8 = cinfo->smoothing_factor * 0x40;
    lVar10 = 0;
    do {
      pJVar3 = output_data[lVar10];
      pbVar4 = input_data[lVar10 + -1];
      pbVar5 = input_data[lVar10];
      pbVar6 = input_data[lVar10 + 1];
      lVar10 = lVar10 + 1;
      bVar1 = *pbVar5;
      iVar12 = (uint)*pbVar6 + (uint)*pbVar4 + (uint)bVar1;
      iVar13 = (uint)pbVar5[1] + (uint)pbVar6[1] + (uint)pbVar4[1];
      *pJVar3 = (JSAMPLE)((uint)bVar1 * iVar9 + ((iVar12 * 2 - (uint)bVar1) + iVar13) * iVar8 +
                          0x8000 >> 0x10);
      lVar7 = 0;
      do {
        iVar14 = iVar13;
        lVar15 = lVar7;
        iVar13 = (uint)pbVar5[lVar15 + 2] + (uint)pbVar6[lVar15 + 2] + (uint)pbVar4[lVar15 + 2];
        pJVar3[lVar15 + 1] =
             (JSAMPLE)((((iVar12 + iVar14) - (uint)pbVar5[lVar15 + 1]) + iVar13) * iVar8 +
                       (uint)pbVar5[lVar15 + 1] * iVar9 + 0x8000 >> 0x10);
        lVar7 = lVar15 + 1;
        iVar12 = iVar14;
      } while (iVar11 + -2 != (int)(lVar15 + 1));
      pJVar3[lVar15 + 2] =
           (JSAMPLE)((uint)pbVar5[lVar15 + 2] * iVar9 +
                     ((iVar14 + iVar13 * 2) - (uint)pbVar5[lVar15 + 2]) * iVar8 + 0x8000 >> 0x10);
    } while (lVar10 < compptr->v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
fullsize_smooth_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                           JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int outrow;
  JDIMENSION colctr;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr, above_ptr, below_ptr, outptr;
  JLONG membersum, neighsum, memberscale, neighscale;
  int colsum, lastcolsum, nextcolsum;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data - 1, cinfo->max_v_samp_factor + 2,
                    cinfo->image_width, output_cols);

  /* Each of the eight neighbor pixels contributes a fraction SF to the
   * smoothed pixel, while the main pixel contributes (1-8*SF).  In order
   * to use integer arithmetic, these factors are multiplied by 2^16 = 65536.
   * Also recall that SF = smoothing_factor / 1024.
   */

  memberscale = 65536L - cinfo->smoothing_factor * 512L; /* scaled 1-8*SF */
  neighscale = cinfo->smoothing_factor * 64; /* scaled SF */

  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr = input_data[outrow];
    above_ptr = input_data[outrow - 1];
    below_ptr = input_data[outrow + 1];

    /* Special case for first column */
    colsum = (*above_ptr++) + (*below_ptr++) + inptr[0];
    membersum = *inptr++;
    nextcolsum = above_ptr[0] + below_ptr[0] + inptr[0];
    neighsum = colsum + (colsum - membersum) + nextcolsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr++ = (JSAMPLE)((membersum + 32768) >> 16);
    lastcolsum = colsum;  colsum = nextcolsum;

    for (colctr = output_cols - 2; colctr > 0; colctr--) {
      membersum = *inptr++;
      above_ptr++;  below_ptr++;
      nextcolsum = above_ptr[0] + below_ptr[0] + inptr[0];
      neighsum = lastcolsum + (colsum - membersum) + nextcolsum;
      membersum = membersum * memberscale + neighsum * neighscale;
      *outptr++ = (JSAMPLE)((membersum + 32768) >> 16);
      lastcolsum = colsum;  colsum = nextcolsum;
    }

    /* Special case for last column */
    membersum = *inptr;
    neighsum = lastcolsum + (colsum - membersum) + colsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr = (JSAMPLE)((membersum + 32768) >> 16);

  }
}